

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertOrAssign<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>_>
::TestBody(InsertOrAssign<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_4UL,_std::mutex>_>
           *this)

{
  long lVar1;
  pointer *__ptr_1;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  K k;
  AssertionResult gtest_ar;
  V val2;
  V val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_7e8;
  AssertHelper local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d8;
  Enum local_7cc;
  undefined1 local_7c8 [8];
  Inner *pIStack_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b8;
  ctrl_t *local_7a8;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_7a0;
  bool local_798;
  undefined1 local_790 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  AssertHelper local_770;
  string local_768;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_748;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_710;
  
  local_7cc = hash_internal::Generator<phmap::priv::hash_internal::Enum,_void>::operator()
                        ((Generator<phmap::priv::hash_internal::Enum,_void> *)&local_710);
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_768,
             (Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)&local_710);
  lVar1 = 0x68;
  do {
    *(undefined8 *)((long)&local_748.first.inner_ + lVar1) = 0;
    *(undefined8 *)((long)local_710.sets_._M_elems + lVar1 + -0x30) = 0;
    *(undefined8 *)((long)&local_768.field_2 + lVar1) = 0;
    *(undefined8 *)((long)&local_768.field_2 + lVar1 + 8) = 0;
    *(undefined8 *)((long)&local_768._M_dataplus._M_p + lVar1) = 0;
    *(undefined8 *)((long)&local_768._M_string_length + lVar1) = 0;
    *(undefined8 *)((long)&local_780 + lVar1 + 8) = 0;
    *(undefined8 *)((long)&local_770.data_ + lVar1) = 0;
    *(undefined8 *)((long)local_710.sets_._M_elems + lVar1 + -0x28) = 0;
    *(undefined8 *)((long)local_710.sets_._M_elems + lVar1 + -0x18) = 0;
    *(long *)((long)local_710.sets_._M_elems + lVar1 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_710.sets_._M_elems + lVar1 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_710.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar1) = 0;
    lVar1 = lVar1 + 0x70;
  } while (lVar1 != 0x768);
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::insert_or_assign_impl<phmap::priv::hash_internal::Enum_const&,std::__cxx11::string_const&>
            (&local_748,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)&local_710,&local_7cc,&local_768);
  local_790[0] = (internal)local_748.second;
  local_788 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((internal)local_748.second == (internal)0x0) {
    testing::Message::Message((Message *)&local_7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7c8,(internal *)local_790,(AssertionResult *)"p.second","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x62,(char *)CONCAT71(local_7c8._1_7_,local_7c8[0]));
    testing::internal::AssertHelper::operator=(&local_7e8,(Message *)&local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_7c8._1_7_,local_7c8[0]) != &local_7b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_7c8._1_7_,local_7c8[0]),
                      (ulong)(local_7b8._M_allocated_capacity + 1));
    }
    if ((long *)CONCAT71(local_7e0.data_._1_7_,local_7e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_7e0.data_._1_7_,local_7e0.data_._0_1_) + 8))();
    }
  }
  if (local_788 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_788,local_788);
  }
  testing::internal::CmpHelperEQ<phmap::priv::hash_internal::Enum,phmap::priv::hash_internal::Enum>
            ((internal *)local_7c8,"k","get<0>(*p.first)",&local_7cc,
             (Enum *)local_748.first.it_.field_1.slot_);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_790);
    if (pIStack_7c0 == (Inner *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)(pIStack_7c0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,99,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)local_790);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if ((long *)CONCAT71(local_790._1_7_,local_790[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_790._1_7_,local_790[0]) + 8))();
    }
  }
  if (pIStack_7c0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pIStack_7c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_7c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_7c8,"val","get<1>(*p.first)",&local_768,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_748.first.it_.field_1.slot_ + 8));
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_790);
    if (pIStack_7c0 == (Inner *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)(pIStack_7c0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e0,(Message *)local_790);
    testing::internal::AssertHelper::~AssertHelper(&local_7e0);
    if ((long *)CONCAT71(local_790._1_7_,local_790[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_790._1_7_,local_790[0]) + 8))();
    }
  }
  if (pIStack_7c0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pIStack_7c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_7c0);
  }
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()((string *)local_790,
             (Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)local_7c8);
  parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
  ::insert_or_assign_impl<phmap::priv::hash_internal::Enum_const&,std::__cxx11::string_const&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_7c8,
             (parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,std::__cxx11::string>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::Enum_const,std::__cxx11::string>>>
              *)&local_710,&local_7cc,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790);
  local_748.first.it_end_.ctrl_ = local_7a8;
  local_748.first.it_end_.field_1 = aStack_7a0;
  local_748.first.it_.ctrl_ = (ctrl_t *)local_7b8._M_allocated_capacity;
  local_748.first.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_7b8._8_8_;
  local_748.first.inner_end_ = pIStack_7c0;
  local_748.second = local_798;
  local_7e0.data_._0_1_ = (internal)(local_798 ^ 1);
  local_7d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_798 != false) {
    testing::Message::Message((Message *)&local_7e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7c8,(internal *)&local_7e0,(AssertionResult *)"p.second","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_770,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x67,(char *)CONCAT71(local_7c8._1_7_,local_7c8[0]));
    testing::internal::AssertHelper::operator=(&local_770,(Message *)&local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_770);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_7c8._1_7_,local_7c8[0]) != &local_7b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_7c8._1_7_,local_7c8[0]),
                      (ulong)(local_7b8._M_allocated_capacity + 1));
    }
    if (local_7e8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_7e8.data_ + 8))();
    }
  }
  if (local_7d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7d8,local_7d8);
  }
  testing::internal::CmpHelperEQ<phmap::priv::hash_internal::Enum,phmap::priv::hash_internal::Enum>
            ((internal *)local_7c8,"k","get<0>(*p.first)",&local_7cc,
             (Enum *)local_748.first.it_.field_1.slot_);
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7e0);
    if (pIStack_7c0 == (Inner *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)(pIStack_7c0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e8,(Message *)&local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e8);
    if ((long *)CONCAT71(local_7e0.data_._1_7_,local_7e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_7e0.data_._1_7_,local_7e0.data_._0_1_) + 8))();
    }
  }
  if (pIStack_7c0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pIStack_7c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_7c0);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_7c8,"val2","get<1>(*p.first)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_790,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_748.first.it_.field_1.slot_ + 8));
  if (local_7c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7e0);
    if (pIStack_7c0 == (Inner *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)(pIStack_7c0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align
      ;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7e8,(Message *)&local_7e0);
    testing::internal::AssertHelper::~AssertHelper(&local_7e8);
    if ((long *)CONCAT71(local_7e0.data_._1_7_,local_7e0.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_7e0.data_._1_7_,local_7e0.data_._0_1_) + 8))();
    }
  }
  if (pIStack_7c0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pIStack_7c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pIStack_7c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_790._1_7_,local_790[0]) != &local_780) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_790._1_7_,local_790[0]),local_780._M_allocated_capacity + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~parallel_hash_set(&local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p,local_768.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertOrAssign) {
#ifdef UNORDERED_MAP_CXX17
  using std::get;
  using K = typename TypeParam::key_type;
  using V = typename TypeParam::mapped_type;
  K k = hash_internal::Generator<K>()();
  V val = hash_internal::Generator<V>()();
  TypeParam m;
  auto p = m.insert_or_assign(k, val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(k, get<0>(*p.first));
  EXPECT_EQ(val, get<1>(*p.first));
  V val2 = hash_internal::Generator<V>()();
  p = m.insert_or_assign(k, val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(k, get<0>(*p.first));
  EXPECT_EQ(val2, get<1>(*p.first));
#endif
}